

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O2

int __thiscall xray_re::xr_surface::compare(xr_surface *this,xr_surface *right)

{
  uint uVar1;
  
  uVar1 = std::__cxx11::string::compare((string *)&this->m_name);
  if (uVar1 == 0) {
    uVar1 = std::__cxx11::string::compare((string *)&this->m_eshader);
    if (uVar1 == 0) {
      uVar1 = std::__cxx11::string::compare((string *)&this->m_cshader);
      if (uVar1 == 0) {
        uVar1 = std::__cxx11::string::compare((string *)&this->m_gamemtl);
        if (uVar1 == 0) {
          uVar1 = std::__cxx11::string::compare((string *)&this->m_texture);
          if (uVar1 == 0) {
            uVar1 = std::__cxx11::string::compare((string *)&this->m_vmap);
            if (uVar1 == 0) {
              uVar1 = 0xffffffff;
              if (right->m_flags <= this->m_flags) {
                uVar1 = (uint)(this->m_flags != right->m_flags);
              }
            }
          }
        }
      }
    }
  }
  return uVar1;
}

Assistant:

int xr_surface::compare(const xr_surface& right) const
{
	int result;
	if ((result = m_name.compare(right.m_name)))
		return result;
	if ((result = m_eshader.compare(right.m_eshader)))
		return result;
	if ((result = m_cshader.compare(right.m_cshader)))
		return result;
	if ((result = m_gamemtl.compare(right.m_gamemtl)))
		return result;
	if ((result = m_texture.compare(right.m_texture)))
		return result;
	if ((result = m_vmap.compare(right.m_vmap)))
		return result;
	if ((result = __compare(m_flags, right.m_flags)))
		return result;
	return __compare(m_flags, right.m_flags);
}